

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O1

void __thiscall dg::vr::Bucket::merge(Bucket *this,Bucket *other)

{
  Type type;
  pointer prVar1;
  pointer prVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->id != other->id) {
    lVar3 = 0;
    do {
      type = *(Type *)((long)&Relations::all + lVar3);
      uVar4 = (ulong)type;
      if (uVar4 != 0) {
        prVar1 = (other->relatedBuckets)._M_elems[uVar4].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (prVar2 = (other->relatedBuckets)._M_elems[uVar4].vec.
                      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; prVar2 != prVar1;
            prVar2 = prVar2 + 1) {
          if (prVar2->_M_data->id != this->id) {
            setRelated(this,type,prVar2->_M_data);
          }
        }
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x30);
  }
  return;
}

Assistant:

bool operator==(const Bucket &lt, const Bucket &rt) {
        return lt.id == rt.id;
    }